

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
           *this,wchar_t *p)

{
  size_t *psVar1;
  wchar_t *pwVar2;
  iterator iVar3;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> local_30;
  
  pwVar2 = (this->parse_context).format_str_.data_;
  (this->parse_context).format_str_.data_ = p;
  psVar1 = &(this->parse_context).format_str_.size_;
  *psVar1 = *psVar1 - ((long)p - (long)pwVar2 >> 2);
  local_30.parse_ctx_ = &this->parse_context;
  local_30.ctx_ = &this->context;
  local_30.
  super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.writer_
  .out_.container = (this->context).out_.container;
  local_30.
  super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.writer_
  .locale_.locale_ = (this->context).loc_.locale_;
  local_30.
  super_arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>.specs_
       = (format_specs *)0x0;
  iVar3 = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                    (&local_30,&this->arg);
  (this->context).out_.container = iVar3.container;
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }